

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O2

void __thiscall
helics::MessageFederate::registerMessageInterfacesToml(MessageFederate *this,string *tomlString)

{
  pointer pbVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  value_type *pvVar5;
  array_type *paVar6;
  Endpoint *pEVar7;
  InvalidParameter *pIVar8;
  value *extraout_RDX;
  value *extraout_RDX_00;
  value *extraout_RDX_01;
  value *pvVar9;
  value *extraout_RDX_02;
  ulong in_R9;
  basic_value<toml::type_config> *ept;
  pointer pbVar10;
  string_view type_00;
  string_view eptName_00;
  string_view sinkName;
  string_view message;
  string_view message_00;
  allocator<char> local_20e;
  bool defaultGlobal;
  uint local_20c;
  string type;
  string eptName;
  undefined1 local_118 [32];
  value doc;
  
  toml::basic_value<toml::type_config>::basic_value(&doc);
  fileops::loadToml((value *)&eptName,tomlString);
  toml::basic_value<toml::type_config>::operator=(&doc,(basic_value<toml::type_config> *)&eptName);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&eptName);
  defaultGlobal = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&eptName,"defaultglobal",(allocator<char> *)&type);
  fileops::replaceIfMember<bool>(&doc,&eptName,&defaultGlobal);
  std::__cxx11::string::~string((string *)&eptName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&eptName,"targeted",(allocator<char> *)&type);
  bVar3 = fileops::getOrDefault(&doc,&eptName,false);
  std::__cxx11::string::~string((string *)&eptName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&eptName,"endpoints",(allocator<char> *)&type);
  bVar4 = fileops::isMember(&doc,&eptName);
  std::__cxx11::string::~string((string *)&eptName);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&eptName,"endpoints",(allocator<char> *)&type);
    pvVar5 = toml::basic_value<toml::type_config>::at(&doc,&eptName);
    std::__cxx11::string::~string((string *)&eptName);
    if (pvVar5->type_ != array) {
      pIVar8 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message._M_str = "endpoints section in toml file must be an array";
      message._M_len = 0x2f;
      InvalidParameter::InvalidParameter(pIVar8,message);
      __cxa_throw(pIVar8,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar6 = toml::basic_value<toml::type_config>::as_array(pvVar5);
    pbVar1 = (paVar6->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_20c = (uint)bVar3;
    pvVar9 = extraout_RDX;
    for (pbVar10 = (paVar6->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
        pbVar10 = pbVar10 + 1) {
      fileops::getName_abi_cxx11_(&eptName,(fileops *)pbVar10,pvVar9);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"type",&local_20e);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_R9;
      fileops::getOrDefault
                (&type,(fileops *)pbVar10,(value *)local_118,(string *)0x0,
                 (string_view)(auVar2 << 0x40));
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"global",&local_20e);
      bVar3 = fileops::getOrDefault(pbVar10,(string *)local_118,defaultGlobal);
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"targeted",&local_20e);
      bVar4 = fileops::getOrDefault(pbVar10,(string *)local_118,SUB41(local_20c,0));
      std::__cxx11::string::~string((string *)local_118);
      in_R9 = (ulong)bVar3;
      type_00._M_str = type._M_dataplus._M_p;
      type_00._M_len = type._M_string_length;
      eptName_00._M_str = eptName._M_dataplus._M_p;
      eptName_00._M_len = eptName._M_string_length;
      pEVar7 = registerEndpoint(this,eptName_00,type_00,bVar3,bVar4);
      loadOptions<toml::basic_value<toml::type_config>>(this,pbVar10,pEVar7);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::~string((string *)&eptName);
      pvVar9 = extraout_RDX_00;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&eptName,"datasinks",(allocator<char> *)&type);
  bVar3 = fileops::isMember(&doc,&eptName);
  std::__cxx11::string::~string((string *)&eptName);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&eptName,"datasinks",(allocator<char> *)&type);
    pvVar5 = toml::basic_value<toml::type_config>::at(&doc,&eptName);
    std::__cxx11::string::~string((string *)&eptName);
    if (pvVar5->type_ != array) {
      pIVar8 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message_00._M_str = "datasinks section in toml file must be an array";
      message_00._M_len = 0x2f;
      InvalidParameter::InvalidParameter(pIVar8,message_00);
      __cxa_throw(pIVar8,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar6 = toml::basic_value<toml::type_config>::as_array(pvVar5);
    pbVar1 = (paVar6->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pvVar9 = extraout_RDX_01;
    for (pbVar10 = (paVar6->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
        pbVar10 = pbVar10 + 1) {
      fileops::getName_abi_cxx11_(&eptName,(fileops *)pbVar10,pvVar9);
      sinkName._M_str = eptName._M_dataplus._M_p;
      sinkName._M_len = eptName._M_string_length;
      pEVar7 = registerDataSink(this,sinkName);
      loadOptions<toml::basic_value<toml::type_config>>(this,pbVar10,pEVar7);
      std::__cxx11::string::~string((string *)&eptName);
      pvVar9 = extraout_RDX_02;
    }
  }
  toml::basic_value<toml::type_config>::~basic_value(&doc);
  return;
}

Assistant:

void MessageFederate::registerMessageInterfacesToml(const std::string& tomlString)
{
    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }
    bool defaultGlobal = false;
    fileops::replaceIfMember(doc, "defaultglobal", defaultGlobal);
    const bool defaultTargeted = fileops::getOrDefault(doc, "targeted", false);
    if (fileops::isMember(doc, "endpoints")) {
        auto& epts = toml::find(doc, "endpoints");
        if (!epts.is_array()) {
            throw(helics::InvalidParameter("endpoints section in toml file must be an array"));
        }
        auto& eptArray = epts.as_array();
        for (auto& ept : eptArray) {
            auto eptName = fileops::getName(ept);
            auto type = fileops::getOrDefault(ept, "type", emptyStr);
            const bool global = fileops::getOrDefault(ept, "global", defaultGlobal);
            const bool targeted = fileops::getOrDefault(ept, "targeted", defaultTargeted);
            Endpoint& epObj = registerEndpoint(eptName, type, global, targeted);

            loadOptions(this, ept, epObj);
        }
    }
    if (fileops::isMember(doc, "datasinks")) {
        auto& epts = toml::find(doc, "datasinks");
        if (!epts.is_array()) {
            throw(helics::InvalidParameter("datasinks section in toml file must be an array"));
        }
        auto& eptArray = epts.as_array();
        for (auto& ept : eptArray) {
            auto key = fileops::getName(ept);
            Endpoint& epObj = registerDataSink(key);

            loadOptions(this, ept, epObj);
        }
    }
}